

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O1

Mat6x6d * __thiscall
OpenMD::HydroProp::getResistanceTensorAtPos
          (Mat6x6d *__return_storage_ptr__,HydroProp *this,Vector3d *pos)

{
  undefined8 uVar1;
  ulong uVar2;
  uint i;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  undefined8 *puVar7;
  uint i_1;
  undefined8 *puVar8;
  undefined8 *puVar9;
  double *pdVar10;
  uint j;
  long lVar11;
  double *pdVar12;
  uint k;
  long lVar13;
  double dVar14;
  Vector<double,_3U> result;
  SquareMatrix3<double> result_11;
  Mat3x3d Xitt;
  Mat3x3d Xipostr;
  Mat3x3d Xitr;
  SquareMatrix3<double> result_1;
  Mat3x3d Xiposrr;
  Mat3x3d Xipostt;
  Mat3x3d Xirr;
  SquareMatrix3<double> result_9;
  SquareMatrix3<double> result_6;
  SquareMatrix3<double> result_3;
  SquareMatrix3<double> result_4;
  RectMatrix<double,_3U,_3U> result_2;
  SquareMatrix3<double> result_8;
  RectMatrix<double,_3U,_3U> result_5;
  double local_518;
  ulong uStack_510;
  ulong local_508;
  ulong uStack_500;
  undefined8 local_4f8;
  double dStack_4f0;
  ulong local_4e8;
  double dStack_4e0;
  undefined8 local_4d8;
  undefined8 local_4c8 [10];
  double local_478 [10];
  undefined8 local_428 [10];
  undefined8 local_3d8 [10];
  double local_388 [10];
  undefined8 local_338 [10];
  undefined8 local_2e8 [10];
  undefined8 local_298 [10];
  double local_248 [10];
  double local_1f8 [10];
  double local_1a8 [10];
  double local_158 [10];
  undefined8 local_108 [10];
  double local_b8 [10];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pdVar4 = &local_518;
  pdVar5 = &local_518;
  pdVar6 = &local_518;
  local_518 = 0.0;
  uStack_510 = 0;
  local_508 = 0;
  lVar3 = 0;
  do {
    (&local_518)[lVar3] =
         (pos->super_Vector<double,_3U>).data_[lVar3] -
         (this->cor_).super_Vector<double,_3U>.data_[lVar3];
    uStack_500 = local_508;
    uVar2 = uStack_510;
    dStack_4e0 = local_518;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  local_4d8 = 0;
  local_518 = 0.0;
  uStack_510 = local_508 ^ 0x8000000000000000;
  local_508 = uVar2;
  local_4f8 = 0;
  dStack_4f0 = -dStack_4e0;
  local_4e8 = uVar2 ^ 0x8000000000000000;
  local_478[8] = 0.0;
  local_478[6] = 0.0;
  local_478[7] = 0.0;
  local_478[4] = 0.0;
  local_478[5] = 0.0;
  local_478[2] = 0.0;
  local_478[3] = 0.0;
  local_478[0] = 0.0;
  local_478[1] = 0.0;
  do {
    *(undefined8 *)((long)local_478 + lVar3 + 0x10) =
         *(undefined8 *)
          ((long)(this->Xi_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar3 * 2 + 0x10);
    puVar7 = (undefined8 *)((long)(this->Xi_).super_RectMatrix<double,_6U,_6U>.data_[0] + lVar3 * 2)
    ;
    uVar1 = puVar7[1];
    *(undefined8 *)((long)local_478 + lVar3) = *puVar7;
    *(undefined8 *)((long)local_478 + lVar3 + 8) = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  local_3d8[6] = 0;
  local_3d8[7] = 0;
  local_3d8[4] = 0;
  local_3d8[5] = 0;
  local_3d8[2] = 0;
  local_3d8[3] = 0;
  local_3d8[0] = 0;
  local_3d8[1] = 0;
  local_3d8[8] = 0;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)local_3d8 + lVar3 + 0x10) =
         *(undefined8 *)
          ((long)((this->S_).super_RectMatrix<double,_6U,_6U>.data_ + -3) + 0x10 + lVar3 * 2);
    puVar7 = (undefined8 *)((long)(this->Xi_).super_RectMatrix<double,_6U,_6U>.data_[3] + lVar3 * 2)
    ;
    uVar1 = puVar7[1];
    *(undefined8 *)((long)local_3d8 + lVar3) = *puVar7;
    *(undefined8 *)((long)local_3d8 + lVar3 + 8) = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  local_298[6] = 0;
  local_298[7] = 0;
  local_298[4] = 0;
  local_298[5] = 0;
  local_298[2] = 0;
  local_298[3] = 0;
  local_298[0] = 0;
  local_298[1] = 0;
  local_298[8] = 0;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)local_298 + lVar3 + 0x10) =
         *(undefined8 *)
          ((long)((this->S_).super_RectMatrix<double,_6U,_6U>.data_ + -3) + 0x28 + lVar3 * 2);
    puVar7 = (undefined8 *)
             ((long)((this->S_).super_RectMatrix<double,_6U,_6U>.data_ + -3) + 0x18 + lVar3 * 2);
    uVar1 = puVar7[1];
    *(undefined8 *)((long)local_298 + lVar3) = *puVar7;
    *(undefined8 *)((long)local_298 + lVar3 + 8) = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  local_2e8[6] = 0;
  local_2e8[7] = 0;
  local_2e8[4] = 0;
  local_2e8[5] = 0;
  local_2e8[2] = 0;
  local_2e8[3] = 0;
  local_2e8[0] = 0;
  local_2e8[1] = 0;
  lVar3 = 0;
  local_2e8[8] = 0;
  local_338[8] = 0;
  local_338[6] = 0;
  local_338[7] = 0;
  local_338[4] = 0;
  local_338[5] = 0;
  local_338[2] = 0;
  local_338[3] = 0;
  local_338[0] = 0;
  local_338[1] = 0;
  local_428[8] = 0;
  local_428[6] = 0;
  local_428[7] = 0;
  local_428[4] = 0;
  local_428[5] = 0;
  local_428[2] = 0;
  local_428[3] = 0;
  local_428[0] = 0;
  local_428[1] = 0;
  do {
    *(undefined8 *)((long)local_2e8 + lVar3 + 0x10) =
         *(undefined8 *)((long)local_478 + lVar3 + 0x10);
    uVar1 = *(undefined8 *)((long)local_478 + lVar3 + 8);
    *(undefined8 *)((long)local_2e8 + lVar3) = *(undefined8 *)((long)local_478 + lVar3);
    *(undefined8 *)((long)local_2e8 + lVar3 + 8) = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  local_388[6] = 0.0;
  local_388[7] = 0.0;
  local_388[4] = 0.0;
  local_388[5] = 0.0;
  local_388[2] = 0.0;
  local_388[3] = 0.0;
  local_388[0] = 0.0;
  local_388[1] = 0.0;
  local_388[8] = 0.0;
  lVar3 = 0;
  do {
    lVar11 = 0;
    pdVar10 = local_478;
    do {
      dVar14 = local_388[lVar3 * 3 + lVar11];
      lVar13 = 0;
      pdVar12 = pdVar10;
      do {
        dVar14 = dVar14 + *(double *)((long)pdVar4 + lVar13 * 8) * *pdVar12;
        lVar13 = lVar13 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar13 != 3);
      local_388[lVar3 * 3 + lVar11] = dVar14;
      lVar11 = lVar11 + 1;
      pdVar10 = pdVar10 + 1;
    } while (lVar11 != 3);
    lVar3 = lVar3 + 1;
    pdVar4 = (double *)((long)pdVar4 + 0x18);
  } while (lVar3 != 3);
  puVar7 = local_108;
  local_108[6] = 0;
  local_108[7] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[8] = 0;
  pdVar4 = local_388;
  puVar8 = local_3d8;
  lVar3 = 0;
  do {
    lVar11 = 0;
    do {
      puVar7[lVar11] = (double)puVar8[lVar11] - pdVar4[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar3 = lVar3 + 1;
    puVar7 = puVar7 + 3;
    pdVar4 = pdVar4 + 3;
    puVar8 = puVar8 + 3;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)local_4c8 + lVar3 + 0x10) =
         *(undefined8 *)((long)local_108 + lVar3 + 0x10);
    uVar1 = *(undefined8 *)((long)local_108 + lVar3 + 8);
    *(undefined8 *)((long)local_4c8 + lVar3) = *(undefined8 *)((long)local_108 + lVar3);
    *(undefined8 *)((long)local_4c8 + lVar3 + 8) = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)local_428 + lVar3 + 0x10) =
         *(undefined8 *)((long)local_4c8 + lVar3 + 0x10);
    uVar1 = *(undefined8 *)((long)local_4c8 + lVar3 + 8);
    *(undefined8 *)((long)local_428 + lVar3) = *(undefined8 *)((long)local_4c8 + lVar3);
    *(undefined8 *)((long)local_428 + lVar3 + 8) = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  local_1a8[6] = 0.0;
  local_1a8[7] = 0.0;
  local_1a8[4] = 0.0;
  local_1a8[5] = 0.0;
  local_1a8[2] = 0.0;
  local_1a8[3] = 0.0;
  local_1a8[0] = 0.0;
  local_1a8[1] = 0.0;
  local_1a8[8] = 0.0;
  lVar3 = 0;
  do {
    lVar11 = 0;
    pdVar4 = local_478;
    do {
      dVar14 = local_1a8[lVar3 * 3 + lVar11];
      lVar13 = 0;
      pdVar10 = pdVar4;
      do {
        dVar14 = dVar14 + *(double *)((long)pdVar5 + lVar13 * 8) * *pdVar10;
        lVar13 = lVar13 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar13 != 3);
      local_1a8[lVar3 * 3 + lVar11] = dVar14;
      lVar11 = lVar11 + 1;
      pdVar4 = pdVar4 + 1;
    } while (lVar11 != 3);
    lVar3 = lVar3 + 1;
    pdVar5 = (double *)((long)pdVar5 + 0x18);
  } while (lVar3 != 3);
  local_158[6] = 0.0;
  local_158[7] = 0.0;
  local_158[4] = 0.0;
  local_158[5] = 0.0;
  local_158[2] = 0.0;
  local_158[3] = 0.0;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_158[8] = 0.0;
  pdVar4 = local_1a8;
  lVar3 = 0;
  do {
    lVar11 = 0;
    pdVar5 = &local_518;
    do {
      dVar14 = local_158[lVar3 * 3 + lVar11];
      lVar13 = 0;
      pdVar10 = pdVar5;
      do {
        dVar14 = dVar14 + pdVar4[lVar13] * *pdVar10;
        lVar13 = lVar13 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar13 != 3);
      local_158[lVar3 * 3 + lVar11] = dVar14;
      lVar11 = lVar11 + 1;
      pdVar5 = pdVar5 + 1;
    } while (lVar11 != 3);
    lVar3 = lVar3 + 1;
    pdVar4 = pdVar4 + 3;
  } while (lVar3 != 3);
  puVar7 = &local_68;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_28 = 0;
  pdVar4 = local_158;
  puVar8 = local_298;
  lVar3 = 0;
  do {
    lVar11 = 0;
    do {
      puVar7[lVar11] = (double)puVar8[lVar11] - pdVar4[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar3 = lVar3 + 1;
    puVar7 = puVar7 + 3;
    pdVar4 = pdVar4 + 3;
    puVar8 = puVar8 + 3;
  } while (lVar3 != 3);
  local_1f8[6] = 0.0;
  local_1f8[7] = 0.0;
  local_1f8[4] = 0.0;
  local_1f8[5] = 0.0;
  local_1f8[2] = 0.0;
  local_1f8[3] = 0.0;
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  local_1f8[8] = 0.0;
  puVar7 = local_3d8;
  lVar3 = 0;
  do {
    lVar11 = 0;
    pdVar4 = &local_518;
    do {
      dVar14 = local_1f8[lVar3 * 3 + lVar11];
      lVar13 = 0;
      pdVar5 = pdVar4;
      do {
        dVar14 = dVar14 + (double)puVar7[lVar13] * *pdVar5;
        lVar13 = lVar13 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar13 != 3);
      local_1f8[lVar3 * 3 + lVar11] = dVar14;
      lVar11 = lVar11 + 1;
      pdVar4 = pdVar4 + 1;
    } while (lVar11 != 3);
    lVar3 = lVar3 + 1;
    puVar7 = puVar7 + 3;
  } while (lVar3 != 3);
  pdVar4 = local_388;
  local_388[6] = 0.0;
  local_388[7] = 0.0;
  local_388[4] = 0.0;
  local_388[5] = 0.0;
  local_388[2] = 0.0;
  local_388[3] = 0.0;
  local_388[0] = 0.0;
  local_388[1] = 0.0;
  local_388[8] = 0.0;
  pdVar5 = local_1f8;
  puVar7 = &local_68;
  lVar3 = 0;
  do {
    lVar11 = 0;
    do {
      pdVar4[lVar11] = (double)puVar7[lVar11] + pdVar5[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar3 = lVar3 + 1;
    pdVar4 = pdVar4 + 3;
    pdVar5 = pdVar5 + 3;
    puVar7 = puVar7 + 3;
  } while (lVar3 != 3);
  pdVar4 = local_b8;
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[8] = 0.0;
  puVar7 = local_3d8;
  lVar3 = 0;
  do {
    lVar11 = 0;
    pdVar5 = pdVar4;
    do {
      *pdVar5 = (double)puVar7[lVar11];
      lVar11 = lVar11 + 1;
      pdVar5 = pdVar5 + 3;
    } while (lVar11 != 3);
    lVar3 = lVar3 + 1;
    pdVar4 = pdVar4 + 1;
    puVar7 = puVar7 + 3;
  } while (lVar3 != 3);
  local_248[6] = 0.0;
  local_248[7] = 0.0;
  local_248[4] = 0.0;
  local_248[5] = 0.0;
  local_248[2] = 0.0;
  local_248[3] = 0.0;
  local_248[0] = 0.0;
  local_248[1] = 0.0;
  local_248[8] = 0.0;
  lVar3 = 0;
  do {
    lVar11 = 0;
    pdVar4 = local_b8;
    do {
      dVar14 = local_248[lVar3 * 3 + lVar11];
      lVar13 = 0;
      pdVar5 = pdVar4;
      do {
        dVar14 = dVar14 + *(double *)((long)pdVar6 + lVar13 * 8) * *pdVar5;
        lVar13 = lVar13 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar13 != 3);
      local_248[lVar3 * 3 + lVar11] = dVar14;
      lVar11 = lVar11 + 1;
      pdVar4 = pdVar4 + 1;
    } while (lVar11 != 3);
    lVar3 = lVar3 + 1;
    pdVar6 = (double *)((long)pdVar6 + 0x18);
  } while (lVar3 != 3);
  puVar7 = local_108;
  local_108[6] = 0;
  local_108[7] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[8] = 0;
  pdVar4 = local_248;
  pdVar5 = local_388;
  lVar3 = 0;
  do {
    lVar11 = 0;
    do {
      puVar7[lVar11] = pdVar5[lVar11] - pdVar4[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar3 = lVar3 + 1;
    puVar7 = puVar7 + 3;
    pdVar4 = pdVar4 + 3;
    pdVar5 = pdVar5 + 3;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)local_4c8 + lVar3 + 0x10) =
         *(undefined8 *)((long)local_108 + lVar3 + 0x10);
    uVar1 = *(undefined8 *)((long)local_108 + lVar3 + 8);
    *(undefined8 *)((long)local_4c8 + lVar3) = *(undefined8 *)((long)local_108 + lVar3);
    *(undefined8 *)((long)local_4c8 + lVar3 + 8) = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)local_338 + lVar3 + 0x10) =
         *(undefined8 *)((long)local_4c8 + lVar3 + 0x10);
    uVar1 = *(undefined8 *)((long)local_4c8 + lVar3 + 8);
    *(undefined8 *)((long)local_338 + lVar3) = *(undefined8 *)((long)local_4c8 + lVar3);
    *(undefined8 *)((long)local_338 + lVar3 + 8) = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  lVar3 = 0;
  memset(__return_storage_ptr__,0,0x120);
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[0] + lVar3 * 2 + 0x10)
         = *(undefined8 *)((long)local_2e8 + lVar3 + 0x10);
    uVar1 = *(undefined8 *)((long)local_2e8 + lVar3 + 8);
    puVar7 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[0] + lVar3 * 2)
    ;
    *puVar7 = *(undefined8 *)((long)local_2e8 + lVar3);
    puVar7[1] = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  puVar7 = local_4c8;
  local_4c8[6] = 0;
  local_4c8[7] = 0;
  local_4c8[4] = 0;
  local_4c8[5] = 0;
  local_4c8[2] = 0;
  local_4c8[3] = 0;
  local_4c8[0] = 0;
  local_4c8[1] = 0;
  local_4c8[8] = 0;
  puVar8 = local_428;
  lVar3 = 0;
  do {
    lVar11 = 0;
    puVar9 = puVar7;
    do {
      *puVar9 = puVar8[lVar11];
      lVar11 = lVar11 + 1;
      puVar9 = puVar9 + 3;
    } while (lVar11 != 3);
    lVar3 = lVar3 + 1;
    puVar7 = puVar7 + 1;
    puVar8 = puVar8 + 3;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[0] + lVar3 * 2 + 0x28)
         = *(undefined8 *)((long)local_4c8 + lVar3 + 0x10);
    uVar1 = *(undefined8 *)((long)local_4c8 + lVar3 + 8);
    puVar7 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[0] +
             lVar3 * 2 + 0x18);
    *puVar7 = *(undefined8 *)((long)local_4c8 + lVar3);
    puVar7[1] = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  lVar3 = 0;
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[3] + lVar3 * 2 + 0x10)
         = *(undefined8 *)((long)local_428 + lVar3 + 0x10);
    uVar1 = *(undefined8 *)((long)local_428 + lVar3 + 8);
    puVar7 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[3] + lVar3 * 2)
    ;
    *puVar7 = *(undefined8 *)((long)local_428 + lVar3);
    puVar7[1] = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  lVar3 = 0;
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[3] + lVar3 * 2 + 0x28)
         = *(undefined8 *)((long)local_338 + lVar3 + 0x10);
    uVar1 = *(undefined8 *)((long)local_338 + lVar3 + 8);
    puVar7 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_RectMatrix<double,_6U,_6U>).data_[3] +
             lVar3 * 2 + 0x18);
    *puVar7 = *(undefined8 *)((long)local_338 + lVar3);
    puVar7[1] = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  return __return_storage_ptr__;
}

Assistant:

Mat6x6d HydroProp::getResistanceTensorAtPos(Vector3d pos) {
    // Vector from reference point to center of resistance  = cor_
    // Vector from reference point to new location = pos
    // Vector from center of resistance to new location = pos - cor_
    Vector3d cp = pos - cor_;
    Mat3x3d U;
    U.setupSkewMat(cp);

    Mat3x3d Xitt = getXitt();
    Mat3x3d Xitr = getXitr();
    Mat3x3d Xirr = getXirr();

    Mat3x3d Xipostt;
    Mat3x3d Xiposrr;
    Mat3x3d Xipostr;

    // Resistance tensors at the new location
    Xipostt = Xitt;
    Xipostr = (Xitr - U * Xitt);
    Xiposrr = Xirr - U * Xitt * U + Xitr * U - U * Xitr.transpose();

    Mat6x6d Xipos;
    Xipos.setSubMatrix(0, 0, Xipostt);
    Xipos.setSubMatrix(0, 3, Xipostr.transpose());
    Xipos.setSubMatrix(3, 0, Xipostr);
    Xipos.setSubMatrix(3, 3, Xiposrr);
    return Xipos;
  }